

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utImporter.cpp
# Opt level: O2

bool __thiscall TestPlugin::CanRead(TestPlugin *this,string *pFile,IOSystem *param_2,bool param_3)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  string extension;
  
  lVar3 = std::__cxx11::string::rfind((char)pFile,0x2e);
  if (lVar3 == -1) {
    bVar2 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&extension,(ulong)pFile);
    bVar1 = std::operator==(&extension,".apple");
    bVar2 = true;
    if (!bVar1) {
      bVar1 = std::operator==(&extension,".mac");
      if (!bVar1) {
        bVar1 = std::operator==(&extension,".linux");
        if (!bVar1) {
          bVar2 = std::operator==(&extension,".windows");
        }
      }
    }
    std::__cxx11::string::~string((string *)&extension);
  }
  return bVar2;
}

Assistant:

virtual bool CanRead(
        const std::string& pFile, IOSystem* /*pIOHandler*/, bool /*test*/) const
    {
        std::string::size_type pos = pFile.find_last_of('.');
        // no file extension - can't read
        if( pos == std::string::npos)
            return false;
        std::string extension = pFile.substr( pos);

        // todo ... make case-insensitive
        return (extension == ".apple" || extension == ".mac" ||
            extension == ".linux" || extension == ".windows" );

    }